

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::setFileTime(int fd,QDateTime *newDate,FileTime time,QSystemError *error)

{
  bool bVar1;
  QSystemError *in_RCX;
  int in_EDX;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  QSystemError local_18;
  QSystemError local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QDateTime::isValid((QDateTime *)
                             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if (((bVar1) && (in_EDX != 1)) && (in_EDX != 2)) {
    QSystemError::QSystemError(&local_18,0x26,StandardLibraryError);
    *in_RCX = local_18;
  }
  else {
    QSystemError::QSystemError(&local_10,0x16,StandardLibraryError);
    *in_RCX = local_10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool QFileSystemEngine::setFileTime(int fd, const QDateTime &newDate, QFile::FileTime time, QSystemError &error)
{
    if (!newDate.isValid()
        || time == QFile::FileBirthTime || time == QFile::FileMetadataChangeTime) {
        error = QSystemError(EINVAL, QSystemError::StandardLibraryError);
        return false;
    }

#if QT_CONFIG(futimens)
    // UTIME_OMIT: leave file timestamp unchanged
    struct timespec ts[2] = {{0, UTIME_OMIT}, {0, UTIME_OMIT}};

    if (time == QFile::FileAccessTime || time == QFile::FileModificationTime) {
        const int idx = time == QFile::FileAccessTime ? 0 : 1;
        const std::chrono::milliseconds msecs{newDate.toMSecsSinceEpoch()};
        ts[idx] = durationToTimespec(msecs);
    }

    if (futimens(fd, ts) == -1) {
        error = QSystemError(errno, QSystemError::StandardLibraryError);
        return false;
    }

    return true;
#else
    Q_UNUSED(fd);
    error = QSystemError(ENOSYS, QSystemError::StandardLibraryError);
    return false;
#endif
}